

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O3

void __thiscall
groundupdbext::MemoryKeyValueStore::setKeyValue
          (MemoryKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  Impl *pIVar1;
  long *plVar2;
  __hashtable *__h;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  pointer local_88;
  pointer local_80;
  pointer local_78;
  undefined **local_60;
  pointer local_50;
  pointer local_40;
  
  std::
  _Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(this->mImpl)._M_t.
                super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>.
                _M_head_impl);
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl;
  std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>::
  pair<groundupdb::EncodedValue_&,_true>
            ((pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue> *)local_a0,key,value);
  std::
  _Hashtable<groundupdb::HashedValue,std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>,std::allocator<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>,std::__detail::_Select1st,std::equal_to<groundupdb::HashedValue>,groundupdbext::HighwayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>
            ((_Hashtable<groundupdb::HashedValue,std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>,std::allocator<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>,std::__detail::_Select1st,std::equal_to<groundupdb::HashedValue>,groundupdbext::HighwayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pIVar1,(pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue> *)local_a0);
  local_60 = &PTR__HashedValue_001d3818;
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50,(long)local_40 - (long)local_50);
  }
  local_a0 = (undefined1  [8])&PTR__HashedValue_001d3818;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80 - local_98._8_8_);
  }
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl;
  if (*(bool *)((long)&(pIVar1->m_cachedStore).
                       super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
               + 8) == true) {
    plVar2 = *(long **)&(pIVar1->m_cachedStore).
                        super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
                        ._M_payload;
    local_a0[0] = value->m_has_value;
    local_a0._4_4_ = value->m_type;
    groundupdb::HashedValue::HashedValue((HashedValue *)local_98,&value->m_value);
    (**(code **)(*plVar2 + 0x10))(plVar2,key,local_a0);
    local_98._0_8_ = &PTR__HashedValue_001d3818;
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return;
}

Assistant:

void
MemoryKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  // Also write to our in-memory unordered map
  // Note: insert on unordered_map does NOT perform an insert if the key already exists
  mImpl->m_keyValueStore.erase(key);
  mImpl->m_keyValueStore.insert({key,value});
  if (mImpl->m_cachedStore) {
    mImpl->m_cachedStore->get()->setKeyValue(key,EncodedValue(value)); // force copy construction of a temporary
  }
}